

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O0

int leveldb::anon_unknown_1::LockOrUnlock(int fd,bool lock)

{
  int iVar1;
  int *piVar2;
  byte in_SIL;
  int in_EDI;
  flock file_lock_info;
  undefined2 local_28;
  undefined2 local_26;
  undefined8 local_20;
  undefined8 local_18;
  byte local_5;
  int local_4;
  
  local_5 = in_SIL & 1;
  local_4 = in_EDI;
  piVar2 = __errno_location();
  *piVar2 = 0;
  memset(&local_28,0,0x20);
  local_28 = 2;
  if ((local_5 & 1) != 0) {
    local_28 = 1;
  }
  local_26 = 0;
  local_20 = 0;
  local_18 = 0;
  iVar1 = fcntl(local_4,6,&local_28);
  return iVar1;
}

Assistant:

int LockOrUnlock(int fd, bool lock) {
  errno = 0;
  struct ::flock file_lock_info;
  std::memset(&file_lock_info, 0, sizeof(file_lock_info));
  file_lock_info.l_type = (lock ? F_WRLCK : F_UNLCK);
  file_lock_info.l_whence = SEEK_SET;
  file_lock_info.l_start = 0;
  file_lock_info.l_len = 0;  // Lock/unlock entire file.
  return ::fcntl(fd, F_SETLK, &file_lock_info);
}